

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Phong.cpp
# Opt level: O3

RGBColor __thiscall pm::Phong::shade(Phong *this,ShadeRecord *sr)

{
  undefined4 uVar1;
  undefined4 uVar2;
  long *plVar3;
  bool bVar4;
  char cVar5;
  ulong uVar6;
  long in_RDX;
  long lVar7;
  ulong uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  RGBColor RVar15;
  Vector3 wi;
  RGBColor *L;
  float local_148;
  float fStack_144;
  float local_140;
  undefined1 local_138 [16];
  undefined1 local_128 [8];
  float fStack_120;
  float fStack_11c;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_100;
  float local_f8;
  float local_ec;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  Phong *local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  float local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  float local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  float local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  undefined1 local_48 [16];
  
  local_c8 = ZEXT416(*(uint *)(in_RDX + 0x40));
  local_d8 = ZEXT416(*(uint *)(in_RDX + 0x44));
  local_e8 = ZEXT416(*(uint *)(in_RDX + 0x48));
  _local_128 = ZEXT416((uint)(sr->ray).o.y);
  local_118 = *(undefined8 *)&(sr->normal).z;
  uStack_110 = 0;
  local_138 = ZEXT416((uint)((sr->ray).o.z * (float)local_118));
  local_a0 = this;
  (**(code **)(**(long **)(*(long *)(in_RDX + 0x60) + 0x70) + 0x18))(&local_100);
  local_138._0_4_ = (float)local_138._0_4_ * local_f8;
  local_128._4_4_ = (float)local_128._0_4_ * (float)local_118 * (float)((ulong)local_100 >> 0x20);
  local_128._0_4_ = (float)local_118 * local_118._4_4_ * (float)local_100;
  fStack_120 = (float)uStack_110 * (float)uStack_110 * 0.0;
  fStack_11c = uStack_110._4_4_ * uStack_110._4_4_ * 0.0;
  lVar7 = *(long *)(*(long *)(in_RDX + 0x60) + 0x80) - *(long *)(*(long *)(in_RDX + 0x60) + 0x78);
  fVar9 = local_118._4_4_;
  if (lVar7 != 0) {
    local_68 = -(float)local_c8._0_4_;
    uStack_64 = local_c8._4_4_ ^ 0x80000000;
    uStack_60 = local_c8._8_4_ ^ 0x80000000;
    uStack_5c = local_c8._12_4_ ^ 0x80000000;
    local_78 = -(float)local_d8._0_4_;
    uStack_74 = local_d8._4_4_ ^ 0x80000000;
    uStack_70 = local_d8._8_4_ ^ 0x80000000;
    uStack_6c = local_d8._12_4_ ^ 0x80000000;
    local_58 = -(float)local_e8._0_4_;
    uStack_54 = local_e8._4_4_ ^ 0x80000000;
    uStack_50 = local_e8._8_4_ ^ 0x80000000;
    uStack_4c = local_e8._12_4_ ^ 0x80000000;
    uVar6 = 0;
    uVar8 = 1;
    do {
      plVar3 = *(long **)(*(long *)(*(long *)(in_RDX + 0x60) + 0x78) + uVar6 * 8);
      (**(code **)(*plVar3 + 0x10))(&local_148,plVar3);
      fVar12 = *(float *)(in_RDX + 0x28);
      fVar9 = *(float *)(in_RDX + 0x2c);
      fVar10 = *(float *)(in_RDX + 0x30);
      fVar14 = fVar10 * local_140 + fVar12 * local_148 + fVar9 * fStack_144;
      if (0.0 < fVar14) {
        local_48 = ZEXT416((uint)fVar14);
        if (*(char *)((long)plVar3 + 0xc) == '\x01') {
          local_100 = *(undefined8 *)(in_RDX + 0x10);
          local_f8 = *(float *)(in_RDX + 0x18);
          local_ec = local_140;
          cVar5 = (**(code **)(*plVar3 + 0x20))(plVar3,&local_100);
          if (cVar5 != '\0') goto LAB_0010dfd6;
          fVar12 = *(float *)(in_RDX + 0x28);
          fVar9 = *(float *)(in_RDX + 0x2c);
          fVar10 = *(float *)(in_RDX + 0x30);
        }
        fVar11 = SUB84(sr->world,0);
        local_118._4_4_ = (float)((ulong)sr->world >> 0x20);
        fVar14 = fVar10 * local_58 + fVar12 * local_68 + fVar9 * local_78;
        local_b8 = fVar11 * local_118._4_4_ * 0.31830987;
        fStack_b4 = *(float *)&sr->tracer * fVar11 * 0.31830987;
        fStack_b0 = 0.0;
        fStack_ac = 0.0;
        local_118._0_4_ = fVar11 * *(float *)((long)&sr->tracer + 4) * 0.31830987;
        uStack_110 = 0;
        fVar9 = ((fVar10 + fVar10) * fVar14 + (float)local_e8._0_4_) * local_140 +
                ((fVar9 + fVar9) * fVar14 + (float)local_d8._0_4_) * fStack_144 +
                ((fVar12 + fVar12) * fVar14 + (float)local_c8._0_4_) * local_148;
        fVar10 = 0.0;
        fVar14 = 0.0;
        fVar11 = 0.0;
        fVar12 = 0.0;
        fVar13 = 0.0;
        if (0.0 < fVar9) {
          uVar1 = sr[1].localHitPoint.y;
          uVar2 = sr[1].localHitPoint.z;
          local_88 = CONCAT44(sr[1].normal.x * (float)uVar1,(float)uVar1 * (float)uVar2);
          uStack_80 = 0;
          local_98 = CONCAT44(uVar2,(float)uVar1 * sr[1].normal.y);
          uStack_90 = 0;
          fVar12 = powf(fVar9,sr[1].normal.z);
          fVar13 = (float)local_98 * fVar12;
          fVar10 = fVar12 * (float)local_88;
          fVar14 = fVar12 * local_88._4_4_;
          fVar11 = fVar12 * (float)uStack_80;
          fVar12 = fVar12 * uStack_80._4_4_;
        }
        local_118 = CONCAT44(local_118._4_4_,(float)local_118 + fVar13);
        local_b8 = local_b8 + fVar10;
        fStack_b4 = fStack_b4 + fVar14;
        fStack_b0 = fStack_b0 + fVar11;
        fStack_ac = fStack_ac + fVar12;
        (**(code **)(*plVar3 + 0x18))(&local_100,plVar3);
        fVar9 = (float)local_48._0_4_ * (float)local_100 * local_b8;
        local_128._4_4_ =
             (float)local_128._4_4_ +
             (float)local_48._0_4_ * (float)((ulong)local_100 >> 0x20) * fStack_b4;
        local_128._0_4_ = (float)local_128._0_4_ + fVar9;
        fStack_120 = fStack_120 + (float)local_48._0_4_ * fStack_b0 * 0.0;
        fStack_11c = fStack_11c + (float)local_48._0_4_ * fStack_ac * 0.0;
        local_138._0_4_ =
             (float)local_138._0_4_ + (float)local_118 * local_f8 * (float)local_48._0_4_;
      }
LAB_0010dfd6:
      bVar4 = uVar8 < (ulong)(lVar7 >> 3);
      uVar6 = uVar8;
      uVar8 = (ulong)((int)uVar8 + 1);
    } while (bVar4);
  }
  (local_a0->super_Material)._vptr_Material = (_func_int **)local_128;
  (local_a0->super_Material).type_ = (Type)local_138._0_8_;
  RVar15.b = fVar9;
  RVar15.r = (float)local_138._0_4_;
  RVar15.g = (float)local_138._4_4_;
  return RVar15;
}

Assistant:

RGBColor Phong::shade(ShadeRecord &sr) const
{
	const Vector3 wo = -sr.ray.d;
	RGBColor L = ambientBrdf_.rho(sr, wo) * sr.world.ambientLight().L(sr);
	const size_t numLights = sr.world.lights().size();

	for (unsigned int i = 0; i < numLights; i++)
	{
		const Light &light = *sr.world.lights()[i];
		Vector3 wi = light.direction(sr);
		const float nDotWi = dot(sr.normal, wi);

		if (nDotWi > 0.0f)
		{
			bool inShadow = false;

			if (light.castShadows())
			{
				Ray shadowRay(sr.hitPoint, wi);
				inShadow = light.inShadow(shadowRay, sr);
			}

			if (inShadow == false)
				L += (diffuseBrdf_.f(sr, wo, wi) + specularBrdf_.f(sr, wo, wi)) * light.L(sr) * nDotWi;
		}
	}

	return L;
}